

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::GenerateMips
          (DeviceContextBase<Diligent::EngineGLImplTraits> *this,ITextureView *pTexView)

{
  Uint32 *pUVar1;
  COMMAND_QUEUE_TYPE CVar2;
  int iVar3;
  undefined4 extraout_var;
  COMMAND_QUEUE_TYPE in_DL;
  COMMAND_QUEUE_TYPE extraout_DL;
  COMMAND_QUEUE_TYPE extraout_DL_00;
  char *in_R8;
  char (*in_R9) [8];
  string msg;
  _Alloc_hider in_stack_ffffffffffffffa8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  String local_38;
  char (*Args) [23];
  
  CVar2 = (this->m_Desc).QueueType;
  if (CVar2 == COMMAND_QUEUE_TYPE_UNKNOWN) {
    if ((this->m_Desc).IsDeferred == false) {
      FormatString<char[79]>
                ((string *)&stack0xffffffffffffffa8,
                 (char (*) [79])
                 "Queue type may never be unknown for immediate contexts. This looks like a bug.");
      DebugAssertionFailed
                (in_stack_ffffffffffffffa8._M_p,"GenerateMips",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x767);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)in_stack_ffffffffffffffa8._M_p != &local_48) {
        operator_delete(in_stack_ffffffffffffffa8._M_p,local_48._M_allocated_capacity + 1);
      }
    }
    FormatString<char[97]>
              ((string *)&stack0xffffffffffffffa8,
               (char (*) [97])
               "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    DebugAssertionFailed
              (in_stack_ffffffffffffffa8._M_p,"GenerateMips",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x767);
    in_DL = extraout_DL;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffffa8._M_p != &local_48) {
      operator_delete(in_stack_ffffffffffffffa8._M_p,local_48._M_allocated_capacity + 1);
      in_DL = extraout_DL_00;
    }
    CVar2 = (this->m_Desc).QueueType;
  }
  if ((~CVar2 & 7) != 0) {
    GetCommandQueueTypeString_abi_cxx11_(&local_38,(Diligent *)(ulong)CVar2,in_DL);
    in_R8 = " queue.";
    FormatString<char[13],char[22],std::__cxx11::string,char[8]>
              ((string *)&stack0xffffffffffffffa8,(Diligent *)"GenerateMips",(char (*) [13])0x90701a
               ,(char (*) [22])&local_38,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",in_R9)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    DebugAssertionFailed
              (in_stack_ffffffffffffffa8._M_p,"GenerateMips",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x767);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffffa8._M_p != &local_48) {
      operator_delete(in_stack_ffffffffffffffa8._M_p,local_48._M_allocated_capacity + 1);
    }
  }
  if (pTexView == (ITextureView *)0x0) {
    FormatString<char[26]>
              ((string *)&stack0xffffffffffffffa8,(char (*) [26])"pTexView must not be null");
    DebugAssertionFailed
              (in_stack_ffffffffffffffa8._M_p,"GenerateMips",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x768);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffffa8._M_p != &local_48) {
      operator_delete(in_stack_ffffffffffffffa8._M_p,local_48._M_allocated_capacity + 1);
    }
  }
  if ((this->m_pActiveRenderPass).m_pObject != (RenderPassGLImpl *)0x0) {
    FormatString<char[58]>
              ((string *)&stack0xffffffffffffffa8,
               (char (*) [58])"GenerateMips command must be used outside of render pass.");
    DebugAssertionFailed
              (in_stack_ffffffffffffffa8._M_p,"GenerateMips",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x769);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffffa8._M_p != &local_48) {
      operator_delete(in_stack_ffffffffffffffa8._M_p,local_48._M_allocated_capacity + 1);
    }
  }
  iVar3 = (*(pTexView->super_IDeviceObject).super_IObject._vptr_IObject[4])(pTexView);
  Args = (char (*) [23])CONCAT44(extraout_var,iVar3);
  if ((*Args)[8] != TEXTURE_VIEW_SHADER_RESOURCE) {
    local_38._M_dataplus._M_p = GetTexViewTypeLiteralName((*Args)[8]);
    in_R8 = (char *)&local_38;
    FormatString<char[23],char_const*,char[57],char_const*,char[52]>
              ((string *)&stack0xffffffffffffffa8,(Diligent *)"Shader resource view \'",Args,
               (char **)"\' can\'t be used to generate mipmaps because its type is ",
               (char (*) [57])in_R8,(char **)". Required view type: TEXTURE_VIEW_SHADER_RESOURCE.",
               (char (*) [52])in_stack_ffffffffffffffa8._M_p);
    DebugAssertionFailed
              (in_stack_ffffffffffffffa8._M_p,"GenerateMips",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x76e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffffa8._M_p != &local_48) {
      operator_delete(in_stack_ffffffffffffffa8._M_p,local_48._M_allocated_capacity + 1);
    }
  }
  if ((Args[1][6] & 1U) == 0) {
    FormatString<char[23],char_const*,char[110]>
              ((string *)&stack0xffffffffffffffa8,(Diligent *)"Shader resource view \'",Args,
               (char **)
               "\' was not created with TEXTURE_VIEW_FLAG_ALLOW_MIP_MAP_GENERATION flag and can\'t be used to generate mipmaps."
               ,(char (*) [110])in_R8);
    DebugAssertionFailed
              (in_stack_ffffffffffffffa8._M_p,"GenerateMips",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x770);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffffa8._M_p != &local_48) {
      operator_delete(in_stack_ffffffffffffffa8._M_p,local_48._M_allocated_capacity + 1);
    }
  }
  pUVar1 = &(this->m_Stats).CommandCounters.GenerateMips;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::GenerateMips(ITextureView* pTexView)
{
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "GenerateMips");
    DEV_CHECK_ERR(pTexView != nullptr, "pTexView must not be null");
    DEV_CHECK_ERR(m_pActiveRenderPass == nullptr, "GenerateMips command must be used outside of render pass.");
#ifdef DILIGENT_DEVELOPMENT
    {
        const TextureViewDesc& ViewDesc = pTexView->GetDesc();
        DEV_CHECK_ERR(ViewDesc.ViewType == TEXTURE_VIEW_SHADER_RESOURCE, "Shader resource view '", ViewDesc.Name,
                      "' can't be used to generate mipmaps because its type is ", GetTexViewTypeLiteralName(ViewDesc.ViewType), ". Required view type: TEXTURE_VIEW_SHADER_RESOURCE.");
        DEV_CHECK_ERR((ViewDesc.Flags & TEXTURE_VIEW_FLAG_ALLOW_MIP_MAP_GENERATION) != 0, "Shader resource view '", ViewDesc.Name,
                      "' was not created with TEXTURE_VIEW_FLAG_ALLOW_MIP_MAP_GENERATION flag and can't be used to generate mipmaps.");
    }
#endif
    ++m_Stats.CommandCounters.GenerateMips;
}